

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::SetupProperties(LWOImporter *this,Importer *pImp)

{
  int iVar1;
  uint uVar2;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = Importer::GetPropertyInteger(pImp,"FAVOUR_SPEED",0);
  this->configSpeedFlag = iVar1 != 0;
  uVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_LWO_ONE_LAYER_ONLY",-1);
  this->configLayerIndex = uVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_61);
  Importer::GetPropertyString(&local_60,pImp,"IMPORT_LWO_ONE_LAYER_ONLY",&local_40);
  std::__cxx11::string::_M_assign((string *)&this->configLayerName);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void LWOImporter::SetupProperties(const Importer* pImp)
{
    configSpeedFlag  = ( 0 != pImp->GetPropertyInteger(AI_CONFIG_FAVOUR_SPEED,0) ? true : false);
    configLayerIndex = pImp->GetPropertyInteger (AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,UINT_MAX);
    configLayerName  = pImp->GetPropertyString  (AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,"");
}